

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

bool Am_Replace_Placeholders
               (Am_Object *cmd,Am_Slot_Key slot,bool *did_a_replace,Am_Value *orig_value,
               Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  unsigned_short uVar5;
  Am_Value *pAVar6;
  ostream *poVar7;
  Am_Wrapper *in_value;
  Am_Object ph;
  Am_Value val;
  Am_Value_List new_list;
  Am_Value_List orig_list;
  Am_Value ret_val;
  Am_Placeholder_Replace_Method replace_method;
  Am_Object local_d0;
  Am_Value local_c8;
  Am_Object local_b8;
  Am_Value_List local_b0;
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Value local_88;
  bool *local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Value_List local_60;
  Am_Object *local_50;
  Am_Object local_48;
  Am_Value_List local_40;
  
  local_78 = did_a_replace;
  pAVar6 = Am_Object::Get(cmd,slot,1);
  Am_Value::operator=(orig_value,pAVar6);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Checking placeholders for cmd ",0x1e);
    poVar7 = operator<<((ostream *)&std::cout,cmd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," slot ",6);
    local_c8.type = slot;
    poVar7 = operator<<(poVar7,(Am_Am_Slot_Key *)&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," orig value ",0xc);
    poVar7 = operator<<(poVar7,orig_value);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::ostream::flush();
  }
  local_c8.type = 0;
  local_c8.value.wrapper_value = (Am_Wrapper *)0x0;
  local_88.type = 0;
  local_88.value.wrapper_value = (Am_Wrapper *)0x0;
  *local_78 = false;
  local_d0.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value::Valid(orig_value);
  bVar2 = true;
  if (!bVar1) goto LAB_001f194b;
  bVar1 = Am_Value_List::Test(orig_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&local_98,orig_value);
    local_50 = sel_widget;
    Am_Value_List::Start(&local_98);
    while (bVar2 = Am_Value_List::Last(&local_98), !bVar2) {
      pAVar6 = Am_Value_List::Get(&local_98);
      Am_Value::operator=(&local_c8,pAVar6);
      if (local_c8.type == 0xa001) {
        Am_Object::Am_Object(&local_b8,&local_c8);
        Am_Object::Am_Object(&local_48,&Am_A_Placeholder);
        bVar1 = Am_Object::Is_Instance_Of(&local_b8,&local_48);
        Am_Object::~Am_Object(&local_48);
        Am_Object::~Am_Object(&local_b8);
      }
      else {
        bVar1 = false;
      }
      if (bVar1 != false) {
        if (!bVar2) {
          Am_Value_List::Am_Value_List(&local_b0);
          Am_Value_List::Start(&local_98);
          goto LAB_001f1750;
        }
        break;
      }
      Am_Value_List::Next(&local_98);
    }
    Am_Value_List::~Am_Value_List(&local_98);
    goto LAB_001f194b;
  }
  if (orig_value->type == 0xa001) {
    Am_Object::Am_Object(&local_b8,orig_value);
    Am_Object::Am_Object(&local_70,&Am_A_Placeholder);
    bVar1 = Am_Object::Is_Instance_Of(&local_b8,&local_70);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&local_b8);
  }
  else {
    bVar1 = false;
  }
  if (bVar1 == false) {
LAB_001f1948:
    bVar2 = true;
  }
  else {
    Am_Object::operator=(&local_d0,orig_value);
    pAVar6 = Am_Object::Get(&local_d0,Am_PLACEHOLDER_REPLACE_METHOD,0);
    Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method
              ((Am_Placeholder_Replace_Method *)&local_98,pAVar6);
    cVar4 = (*(code *)local_98.item)(&local_d0,new_value,sel_widget);
    bVar1 = Am_Value_List::Test(new_value);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_b0,new_value);
      uVar5 = Am_Value_List::Length(&local_b0);
      bVar1 = uVar5 == 1;
      Am_Value_List::~Am_Value_List(&local_b0);
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_60,new_value);
      Am_Value_List::Start(&local_60);
      pAVar6 = Am_Value_List::Get(&local_60);
      Am_Value::operator=(new_value,pAVar6);
      Am_Value_List::~Am_Value_List(&local_60);
    }
    if (cVar4 != '\0') {
      *local_78 = true;
      if (am_sdebug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found one placeholder and replaced with ",0x28);
        poVar7 = operator<<((ostream *)&std::cout,new_value);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::ostream::flush();
      }
      if (cVar4 != '\0') goto LAB_001f1948;
    }
    bVar2 = false;
  }
LAB_001f194b:
  Am_Object::~Am_Object(&local_d0);
  Am_Value::~Am_Value(&local_88);
  Am_Value::~Am_Value(&local_c8);
  return bVar2;
LAB_001f1750:
  bVar1 = Am_Value_List::Last(&local_98);
  if (bVar1) goto LAB_001f18cd;
  pAVar6 = Am_Value_List::Get(&local_98);
  Am_Value::operator=(&local_c8,pAVar6);
  if (local_c8.type == 0xa001) {
    Am_Object::Am_Object(&local_68,&local_c8);
    Am_Object::Am_Object(&local_a0,&Am_A_Placeholder);
    bVar3 = Am_Object::Is_Instance_Of(&local_68,&local_a0);
    Am_Object::~Am_Object(&local_a0);
    Am_Object::~Am_Object(&local_68);
  }
  else {
    bVar3 = false;
  }
  if (bVar3 == false) {
    Am_Value_List::Add(&local_b0,&local_c8,Am_TAIL,true);
  }
  else {
    Am_Object::operator=(&local_d0,&local_c8);
    pAVar6 = Am_Object::Get(&local_d0,Am_PLACEHOLDER_REPLACE_METHOD,0);
    Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method
              ((Am_Placeholder_Replace_Method *)&local_60,pAVar6);
    cVar4 = (*(code *)local_60.item)(&local_d0,&local_88,local_50);
    if (cVar4 == '\0') goto LAB_001f192f;
    bVar3 = Am_Value::Valid(&local_88);
    if (bVar3) {
      bVar3 = Am_Value_List::Test(&local_88);
      if (bVar3) {
        Am_Value_List::Am_Value_List(&local_40,&local_88);
        Am_Value_List::Append(&local_b0,&local_40,true);
        Am_Value_List::~Am_Value_List(&local_40);
      }
      else {
        Am_Value_List::Add(&local_b0,&local_88,Am_TAIL,true);
      }
    }
    if (cVar4 == '\0') goto LAB_001f192f;
  }
  Am_Value_List::Next(&local_98);
  goto LAB_001f1750;
LAB_001f18cd:
  *local_78 = true;
  in_value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_b0);
  Am_Value::operator=(new_value,in_value);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Found placeholders in list and replaced with ",0x2d);
    poVar7 = operator<<((ostream *)&std::cout,new_value);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::ostream::flush();
  }
LAB_001f192f:
  Am_Value_List::~Am_Value_List(&local_b0);
  Am_Value_List::~Am_Value_List(&local_98);
  if (!bVar1) goto LAB_001f194b;
  goto LAB_001f1948;
}

Assistant:

bool
Am_Replace_Placeholders(Am_Object &cmd, Am_Slot_Key slot, bool &did_a_replace,
                        Am_Value &orig_value, Am_Value &new_value,
                        Am_Object &sel_widget)
{
  orig_value = cmd.Peek(slot);
  if (am_sdebug)
    std::cout << "Checking placeholders for cmd " << cmd << " slot "
              << Am_Am_Slot_Key(slot) << " orig value " << orig_value
              << std::endl
              << std::flush;
  Am_Value val, ret_val;
  bool ok;
  did_a_replace = false;
  Am_Object ph;
  if (!orig_value.Valid())
    return true; //nothing to do, and is OK
  else if (Am_Value_List::Test(orig_value)) {
    Am_Value_List orig_list = orig_value;
    //first, search to see if any placeholders
    bool found_one = false;
    for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
      val = orig_list.Get();
      if (val.type == Am_OBJECT &&
          Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
        found_one = true;
        break;
      }
    }
    if (!found_one)
      return true;
    else {
      Am_Value_List new_list;
      for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
        val = orig_list.Get();
        if (val.type == Am_OBJECT &&
            Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
          ph = val;
          Am_Placeholder_Replace_Method replace_method =
              ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
          ok = replace_method.Call(ph, ret_val, sel_widget);
          if (!ok)
            return false;
          if (ret_val.Valid()) { //otherwise, leave new_list without ret_val
            if (Am_Value_List::Test(ret_val))
              new_list.Append(ret_val);
            else
              new_list.Add(ret_val);
          }
        } else
          new_list.Add(val);
      }
      did_a_replace = true;
      new_value = new_list;
      if (am_sdebug)
        std::cout << "Found placeholders in list and replaced with "
                  << new_value << std::endl
                  << std::flush;
    }
  } else { //not a list
    if (orig_value.type == Am_OBJECT &&
        Am_Object(orig_value).Is_Instance_Of(Am_A_Placeholder)) {
      ph = orig_value;
      Am_Placeholder_Replace_Method replace_method =
          ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
      ok = replace_method.Call(ph, new_value, sel_widget);
      if (Am_Value_List::Test(new_value) &&
          Am_Value_List(new_value).Length() == 1) {
        Am_Value_List l = new_value;
        l.Start();
        new_value = l.Get();
      }
      if (!ok)
        return false;
      did_a_replace = true;
      if (am_sdebug)
        std::cout << "Found one placeholder and replaced with " << new_value
                  << std::endl
                  << std::flush;
    }
  }
  return true;
}